

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O0

int cuddInitCache(DdManager *unique,uint cacheSize,uint maxCacheSize)

{
  int iVar1;
  uint uVar2;
  DdCache *pDVar3;
  uint local_40;
  uint local_3c;
  ptruint offset;
  DdNodePtr *mem;
  uint logSize;
  int i;
  uint maxCacheSize_local;
  uint cacheSize_local;
  DdManager *unique_local;
  
  local_3c = cacheSize;
  if (cacheSize < unique->slots >> 1) {
    local_3c = unique->slots >> 1;
  }
  iVar1 = cuddComputeFloorLog2(local_3c);
  uVar2 = 1 << ((byte)iVar1 & 0x1f);
  pDVar3 = (DdCache *)malloc((ulong)(uVar2 + 2) * 0x28);
  unique->acache = pDVar3;
  if (unique->acache == (DdCache *)0x0) {
    unique->errorCode = CUDD_MEMORY_OUT;
    unique_local._4_4_ = 0;
  }
  else {
    unique->cache =
         (DdCache *)
         ((long)&unique->acache->f + (0x20 - ((ulong)unique->acache & 0x1f) & 0xfffffffffffffff8));
    if (((ulong)unique->cache & 0x1f) != 0) {
      __assert_fail("((ptruint) unique->cache & (32 - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCache.c"
                    ,0xac,"int cuddInitCache(DdManager *, unsigned int, unsigned int)");
    }
    unique->memused = (ulong)(uVar2 + 1) * 0x28 + unique->memused;
    unique->cacheSlots = uVar2;
    unique->cacheShift = 0x20 - iVar1;
    unique->maxCacheHard = maxCacheSize;
    local_40 = maxCacheSize;
    if (unique->slots << 2 < maxCacheSize) {
      local_40 = unique->slots << 2;
    }
    unique->cacheSlack = local_40 + uVar2 * -2;
    Cudd_SetMinHit(unique,0x1e);
    unique->cacheMisses = (double)(int)((double)uVar2 * unique->minHit + 1.0);
    unique->cacheHits = 0.0;
    unique->totCachehits = 0.0;
    unique->totCacheMisses = -unique->cacheMisses;
    unique->cachecollisions = 0.0;
    unique->cacheinserts = 0.0;
    unique->cacheLastInserts = 0.0;
    unique->cachedeletions = 0.0;
    for (mem._4_4_ = 0; mem._4_4_ < uVar2; mem._4_4_ = mem._4_4_ + 1) {
      unique->cache[(int)mem._4_4_].h = 0;
      unique->cache[(int)mem._4_4_].data = (DdNode *)0x0;
    }
    unique_local._4_4_ = 1;
  }
  return unique_local._4_4_;
}

Assistant:

int
cuddInitCache(
  DdManager * unique /* unique table */,
  unsigned int cacheSize /* initial size of the cache */,
  unsigned int maxCacheSize /* cache size beyond which no resizing occurs */)
{
    int i;
    unsigned int logSize;
#ifndef DD_CACHE_PROFILE
    DdNodePtr *mem;
    ptruint offset;
#endif

    /* Round cacheSize to largest power of 2 not greater than the requested
    ** initial cache size. */
    logSize = cuddComputeFloorLog2(ddMax(cacheSize,unique->slots/2));
    cacheSize = 1 << logSize;
//    unique->acache = ABC_ALLOC(DdCache,cacheSize+1);
    unique->acache = ABC_ALLOC(DdCache,cacheSize+2);
    if (unique->acache == NULL) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    /* If the size of the cache entry is a power of 2, we want to
    ** enforce alignment to that power of two. This happens when
    ** DD_CACHE_PROFILE is not defined. */
#ifdef DD_CACHE_PROFILE
    unique->cache = unique->acache;
    unique->memused += (cacheSize) * sizeof(DdCache);
#else
    mem = (DdNodePtr *) unique->acache;
//    offset = (ptruint) mem & (sizeof(DdCache) - 1);
//    mem += (sizeof(DdCache) - offset) / sizeof(DdNodePtr);
    offset = (ptruint) mem & (32 - 1);
    mem += (32 - offset) / sizeof(DdNodePtr);
    unique->cache = (DdCache *) mem;
//    assert(((ptruint) unique->cache & (sizeof(DdCache) - 1)) == 0);
    assert(((ptruint) unique->cache & (32 - 1)) == 0);
    unique->memused += (cacheSize+1) * sizeof(DdCache);
#endif
    unique->cacheSlots = cacheSize;
    unique->cacheShift = sizeof(int) * 8 - logSize;
    unique->maxCacheHard = maxCacheSize;
    /* If cacheSlack is non-negative, we can resize. */
    unique->cacheSlack = (int) ddMin(maxCacheSize,
        DD_MAX_CACHE_TO_SLOTS_RATIO*unique->slots) -
        2 * (int) cacheSize;
    Cudd_SetMinHit(unique,DD_MIN_HIT);
    /* Initialize to avoid division by 0 and immediate resizing. */
    unique->cacheMisses = (double) (int) (cacheSize * unique->minHit + 1);
    unique->cacheHits = 0;
    unique->totCachehits = 0;
    /* The sum of cacheMisses and totCacheMisses is always correct,
    ** even though cacheMisses is larger than it should for the reasons
    ** explained above. */
    unique->totCacheMisses = -unique->cacheMisses;
    unique->cachecollisions = 0;
    unique->cacheinserts = 0;
    unique->cacheLastInserts = 0;
    unique->cachedeletions = 0;

    /* Initialize the cache */
    for (i = 0; (unsigned) i < cacheSize; i++) {
        unique->cache[i].h = 0; /* unused slots */
        unique->cache[i].data = NULL; /* invalid entry */
#ifdef DD_CACHE_PROFILE
        unique->cache[i].count = 0;
#endif
    }

    return(1);

}